

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O1

void acc_net_add(Item *qname,Item *qpar1,Item *qexpr,Item *qpar2,char *xarg1,char *xarg2)

{
  Item *pIVar1;
  char *sym;
  
  if (artificial_cell != 0) {
    return;
  }
  sprintf(buf,"\n#if NET_RECEIVE_BUFFERING\n    _net_send_buffering(_ml->_net_send_buffer, %s",xarg1
         );
  sym = buf;
  insertstr(qname,buf);
  pIVar1 = qpar1->next;
  do {
    if (pIVar1 == qpar2) {
      sprintf(buf,"%s);\n#else\n",xarg2);
      insertstr(qname,buf);
      insertstr(qpar2->next,"\n#endif\n");
      return;
    }
    if (pIVar1->itemtype == 0x143) {
      sym = (pIVar1->element).str;
      insertstr(qname,sym);
    }
    else {
      if (pIVar1->itemtype != 1) {
        diag("acc_net_add failed because item neither STRING nor SYMBOL",sym);
      }
      sym = (char *)(pIVar1->element).sym;
      insertsym(qname,(Symbol *)sym);
    }
    pIVar1 = pIVar1->next;
  } while( true );
}

Assistant:

void acc_net_add(Item* qname, Item* qpar1, Item* qexpr, Item* qpar2, const char* xarg1, const char* xarg2) {
  Item *q;
  if (artificial_cell) { return; }
  sprintf(buf, "\
\n#if NET_RECEIVE_BUFFERING\
\n    _net_send_buffering(_ml->_net_send_buffer, %s\
", xarg1);
  Insertstr(qname, buf);
  for (q = qpar1->next; q != qpar2; q = q->next) {
    if (q->itemtype == SYMBOL) {
	    insertsym(qname, SYM(q));
    }else if (q->itemtype == STRING) {
      insertstr(qname, STR(q));
    }else{
      diag("acc_net_add failed because item neither STRING nor SYMBOL");
    }
  }
  sprintf(buf, "%s);\n#else\n", xarg2);
  Insertstr(qname, buf);
  Insertstr(qpar2->next, "\n#endif\n");
}